

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void cf_setup_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined4 *puVar1;
  cf_setup_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined4 *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  *puVar1 = 0;
  if (cf->next != (Curl_cfilter *)0x0) {
    (*(code *)cf->next->cft->do_close)(cf->next,data);
    Curl_conn_cf_discard_chain(&cf->next,data);
  }
  return;
}

Assistant:

static void cf_setup_close(struct Curl_cfilter *cf,
                           struct Curl_easy *data)
{
  struct cf_setup_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  ctx->state = CF_SETUP_INIT;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}